

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_ScriptRunning(FParser *this)

{
  int iVar1;
  DFraggleThinker *pDVar2;
  DRunningScript *pDVar3;
  DFsScript *pDVar4;
  
  if (this->t_argc < 1) {
    script_error("not enough arguments to function\n");
    return;
  }
  iVar1 = intvalue(this->t_argv);
  pDVar2 = GC::ReadBarrier<DFraggleThinker>((DFraggleThinker **)&DFraggleThinker::ActiveThinker);
  pDVar3 = GC::ReadBarrier<DRunningScript>((DRunningScript **)&pDVar2->RunningScripts);
  do {
    pDVar3 = GC::ReadBarrier<DRunningScript>((DRunningScript **)&pDVar3->next);
    if (pDVar3 == (DRunningScript *)0x0) {
      (this->t_return).type = 1;
      (this->t_return).value.i = 0;
      return;
    }
    pDVar4 = GC::ReadBarrier<DFsScript>((DFsScript **)&pDVar3->script);
  } while (pDVar4->scriptnum != iVar1);
  (this->t_return).type = 1;
  (this->t_return).value.i = 1;
  return;
}

Assistant:

void FParser::SF_ScriptRunning()
{
	DRunningScript *current;
	int snum = 0;
	
	if(t_argc < 1)
	{
		script_error("not enough arguments to function\n");
		return;
	}
	
	snum = intvalue(t_argv[0]);  
	
	for(current = DFraggleThinker::ActiveThinker->RunningScripts->next; current; current=current->next)
	{
		if(current->script->scriptnum == snum)
		{
			// script found so return
			t_return.type = svt_int;
			t_return.value.i = 1;
			return;
		}
	}
	
	// script not found
	t_return.type = svt_int;
	t_return.value.i = 0;
}